

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_operator_visitor.cpp
# Opt level: O2

void __thiscall
duckdb::LogicalOperatorVisitor::VisitChildOfOperatorWithProjectionMap
          (LogicalOperatorVisitor *this,LogicalOperator *child,
          vector<unsigned_long,_true> *projection_map)

{
  size_type *psVar1;
  bool bVar2;
  const_reference pvVar3;
  ulong uVar4;
  const_reference pvVar5;
  vector<unsigned_long,_true> *__range1;
  size_type *psVar6;
  vector<duckdb::ColumnBinding,_true> child_bindings_after;
  vector<unsigned_long,_true> new_projection_map;
  vector<duckdb::ColumnBinding,_true> child_bindings_before;
  ulong local_88;
  _Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_> local_80;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_68;
  _Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_> local_48;
  
  (*child->_vptr_LogicalOperator[2])(&local_48);
  (*this->_vptr_LogicalOperatorVisitor[2])(this,child);
  if ((projection_map->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (projection_map->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    (*child->_vptr_LogicalOperator[2])(&local_80,child);
    bVar2 = ::std::operator==((vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                               *)&local_48,
                              (vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                               *)&local_80);
    if (!bVar2) {
      local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_68,
                 (long)(projection_map->super_vector<unsigned_long,_std::allocator<unsigned_long>_>)
                       .super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(projection_map->super_vector<unsigned_long,_std::allocator<unsigned_long>_>)
                       .super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3);
      psVar1 = (projection_map->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (psVar6 = (projection_map->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start; psVar6 != psVar1; psVar6 = psVar6 + 1) {
        pvVar3 = vector<duckdb::ColumnBinding,_true>::get<true>
                           ((vector<duckdb::ColumnBinding,_true> *)&local_48,*psVar6);
        local_88 = 0;
        while( true ) {
          uVar4 = (long)local_80._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_80._M_impl.super__Vector_impl_data._M_start >> 4;
          if (uVar4 <= local_88) break;
          pvVar5 = vector<duckdb::ColumnBinding,_true>::get<true>
                             ((vector<duckdb::ColumnBinding,_true> *)&local_80,local_88);
          if ((pvVar5->table_index == pvVar3->table_index) &&
             (pvVar5->column_index == pvVar3->column_index)) {
            uVar4 = (long)local_80._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_80._M_impl.super__Vector_impl_data._M_start >> 4;
            break;
          }
          local_88 = local_88 + 1;
        }
        if (local_88 == uVar4) {
          if (local_68._M_impl.super__Vector_impl_data._M_finish !=
              local_68._M_impl.super__Vector_impl_data._M_start) {
            local_68._M_impl.super__Vector_impl_data._M_finish =
                 local_68._M_impl.super__Vector_impl_data._M_start;
          }
          break;
        }
        ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_68,&local_88);
      }
      ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)projection_map,&local_68);
      ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_68);
    }
    ::std::_Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>::
    ~_Vector_base(&local_80);
  }
  ::std::_Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>::~_Vector_base
            (&local_48);
  return;
}

Assistant:

void LogicalOperatorVisitor::VisitChildOfOperatorWithProjectionMap(LogicalOperator &child,
                                                                   vector<idx_t> &projection_map) {
	const auto child_bindings_before = child.GetColumnBindings();
	VisitOperator(child);
	if (projection_map.empty()) {
		return; // Nothing to fix here
	}
	// Child binding order may have changed due to 'fun'.
	const auto child_bindings_after = child.GetColumnBindings();
	if (child_bindings_before == child_bindings_after) {
		return; // Nothing changed
	}
	// The desired order is 'projection_map' applied to 'child_bindings_before'
	// We create 'new_projection_map', which ensures this order even if 'child_bindings_after' is different
	vector<idx_t> new_projection_map;
	new_projection_map.reserve(projection_map.size());
	for (const auto proj_idx_before : projection_map) {
		auto &desired_binding = child_bindings_before[proj_idx_before];
		idx_t proj_idx_after;
		for (proj_idx_after = 0; proj_idx_after < child_bindings_after.size(); proj_idx_after++) {
			if (child_bindings_after[proj_idx_after] == desired_binding) {
				break;
			}
		}
		if (proj_idx_after == child_bindings_after.size()) {
			// VisitOperator has removed this binding, e.g., by replacing one binding with another
			// Inside here we don't know how it has been replaced, and projection maps are positional: bail
			new_projection_map.clear();
			break;
		}
		new_projection_map.push_back(proj_idx_after);
	}
	projection_map = std::move(new_projection_map);
}